

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::PotVecAccumulator::getStdDev(PotVecAccumulator *this,ResultType *ret)

{
  double *pdVar1;
  Vector<double,_7U> *in_RSI;
  double dVar2;
  uint i;
  ResultType var;
  uint local_4c;
  ResultType *in_stack_ffffffffffffffb8;
  PotVecAccumulator *in_stack_ffffffffffffffc0;
  
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&stack0xffffffffffffffb8);
  getVariance(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  for (local_4c = 0; local_4c < 7; local_4c = local_4c + 1) {
    pdVar1 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)&stack0xffffffffffffffb8,local_4c)
    ;
    dVar2 = sqrt(*pdVar1);
    pdVar1 = Vector<double,_7U>::operator[](in_RSI,local_4c);
    *pdVar1 = dVar2;
  }
  return;
}

Assistant:

void getStdDev(ResultType& ret) {
      assert(Count_ != 0);
      ResultType var;
      this->getVariance(var);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        ret[i] = sqrt(var[i]);
      }
      return;
    }